

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  SQFunctionProto *pSVar7;
  long lVar8;
  SQSharedState *pSVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  long *plVar12;
  long lVar13;
  SQTable *pSVar14;
  SQWeakRef *pSVar15;
  SQTable *pSVar16;
  CallInfo *pCVar17;
  bool bVar18;
  SQArray *this_00;
  SQGenerator *this_01;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  SQObjectPtr temp;
  SQObjectPtr local_40;
  
  pSVar7 = closure->_function;
  lVar21 = pSVar7->_nparameters;
  lVar8 = pSVar7->_stacksize;
  if (pSVar7->_varparams == 0) {
    if (lVar21 != args) {
      lVar19 = pSVar7->_ndefaultparams;
      lVar22 = lVar21 - args;
      if (((lVar22 == 0 || lVar21 < args) || lVar19 == 0) ||
         (lVar21 = lVar19 - lVar22, lVar19 < lVar22)) goto LAB_0012aee6;
      if (0 < lVar22) {
        lVar22 = args * 0x10 + stackbase * 0x10;
        uVar24 = lVar21 * 0x10 | 8;
        do {
          pSVar10 = closure->_defaultparams;
          pSVar11 = (this->_stack)._vals;
          uVar3 = *(uint *)((long)&(pSVar11->super_SQObject)._type + lVar22);
          plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._unVal + lVar22);
          lVar20 = *(long *)((long)&(pSVar10->super_SQObject)._type + uVar24);
          *(long *)((long)&(pSVar11->super_SQObject)._unVal + lVar22) = lVar20;
          uVar4 = *(uint *)((long)pSVar10 + (uVar24 - 8));
          *(uint *)((long)&(pSVar11->super_SQObject)._type + lVar22) = uVar4;
          if ((uVar4 >> 0x1b & 1) != 0) {
            plVar1 = (long *)(lVar20 + 8);
            *plVar1 = *plVar1 + 1;
          }
          if ((uVar3 >> 0x1b & 1) != 0) {
            plVar1 = plVar12 + 1;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (**(code **)(*plVar12 + 0x10))();
            }
          }
          lVar21 = lVar21 + 1;
          lVar22 = lVar22 + 0x10;
          uVar24 = uVar24 + 0x10;
        } while (lVar21 < lVar19);
      }
    }
  }
  else {
    lVar19 = lVar21 + -1;
    lVar22 = args - lVar19;
    if (args < lVar19) {
LAB_0012aee6:
      Raise_Error(this,"wrong number of parameters");
      return false;
    }
    pSVar9 = this->_sharedstate;
    this_00 = (SQArray *)sq_vm_malloc(0x48);
    SQArray::SQArray(this_00,pSVar9,lVar22);
    lVar19 = lVar19 + stackbase;
    if (0 < lVar22) {
      lVar20 = lVar19 * 0x10;
      lVar23 = (lVar21 + stackbase) * 0x10 + -8;
      lVar21 = 8;
      do {
        pSVar10 = (this->_stack)._vals;
        pSVar11 = (this_00->_values)._vals;
        uVar3 = *(uint *)((long)pSVar11 + lVar21 + -8);
        plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar21);
        lVar13 = *(long *)((long)&(pSVar10->super_SQObject)._type + lVar23);
        *(long *)((long)&(pSVar11->super_SQObject)._type + lVar21) = lVar13;
        uVar4 = *(uint *)((long)&(pSVar10->super_SQObject)._type + lVar20);
        *(uint *)((long)pSVar11 + lVar21 + -8) = uVar4;
        if ((uVar4 >> 0x1b & 1) != 0) {
          plVar1 = (long *)(lVar13 + 8);
          *plVar1 = *plVar1 + 1;
        }
        if ((uVar3 >> 0x1b & 1) != 0) {
          plVar1 = plVar12 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar12 + 0x10))();
          }
        }
        pSVar10 = (this->_stack)._vals;
        plVar12 = *(long **)((long)&(pSVar10->super_SQObject)._type + lVar23);
        uVar3 = *(uint *)((long)&(pSVar10->super_SQObject)._type + lVar20);
        *(undefined4 *)((long)&(pSVar10->super_SQObject)._type + lVar20) = 0x1000001;
        *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar23) = 0;
        if ((uVar3 >> 0x1b & 1) != 0) {
          plVar1 = plVar12 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar12 + 0x10))();
          }
        }
        lVar20 = lVar20 + 0x10;
        lVar23 = lVar23 + 0x10;
        lVar21 = lVar21 + 0x10;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    pSVar10 = (this->_stack)._vals;
    pSVar14 = pSVar10[lVar19].super_SQObject._unVal.pTable;
    SVar5 = pSVar10[lVar19].super_SQObject._type;
    pSVar10[lVar19].super_SQObject._type = OT_ARRAY;
    pSVar10[lVar19].super_SQObject._unVal.pArray = this_00;
    pSVar2 = &(this_00->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  pSVar15 = closure->_env;
  if (pSVar15 != (SQWeakRef *)0x0) {
    pSVar10 = (this->_stack)._vals;
    SVar5 = pSVar10[stackbase].super_SQObject._type;
    pSVar14 = pSVar10[stackbase].super_SQObject._unVal.pTable;
    pSVar16 = (pSVar15->_obj)._unVal.pTable;
    pSVar10[stackbase].super_SQObject._unVal.pTable = pSVar16;
    SVar6 = (pSVar15->_obj)._type;
    pSVar10[stackbase].super_SQObject._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar16->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
    }
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  bVar18 = EnterFrame(this,stackbase,lVar8 + stackbase,tailcall);
  if (bVar18) {
    pCVar17 = this->ci;
    pSVar14 = (pCVar17->_closure).super_SQObject._unVal.pTable;
    SVar5 = (pCVar17->_closure).super_SQObject._type;
    (pCVar17->_closure).super_SQObject._type = OT_CLOSURE;
    (pCVar17->_closure).super_SQObject._unVal.pClosure = closure;
    pSVar2 = &(closure->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pCVar17 = this->ci;
    pCVar17->_literals = pSVar7->_literals;
    pCVar17->_ip = pSVar7->_instructions;
    pCVar17->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar7 = closure->_function;
    if (pSVar7->_bgenerator != true) {
      return true;
    }
    pSVar9 = this->_sharedstate;
    this_01 = (SQGenerator *)sq_vm_malloc(0xc0);
    SQGenerator::SQGenerator(this_01,pSVar9,closure);
    bVar18 = SQGenerator::Yield(this_01,this,pSVar7->_stacksize);
    if (bVar18) {
      local_40.super_SQObject._type = OT_NULL;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      Return(this,1,target,&local_40);
      lVar21 = this->_stackbase;
      pSVar10 = (this->_stack)._vals;
      pSVar14 = pSVar10[lVar21 + target].super_SQObject._unVal.pTable;
      SVar5 = pSVar10[lVar21 + target].super_SQObject._type;
      pSVar10[lVar21 + target].super_SQObject._type = OT_GENERATOR;
      pSVar10[lVar21 + target].super_SQObject._unVal.pGenerator = this_01;
      pSVar2 = &(this_01->super_SQCollectable).super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar2 = &(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar2 = *pSVar2 - 1;
        if (*pSVar2 == 0) {
          (*(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_40);
      return true;
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}